

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O3

void Msat_OrderVarUnassigned(Msat_Order_t *p,int Var)

{
  Msat_IntVec_t *pMVar1;
  Msat_IntVec_t *p_00;
  int iVar2;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  iVar2 = clock_gettime(3,&local_30);
  if (iVar2 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  if ((-1 < Var) && (pMVar1 = p->vIndex, Var < pMVar1->nSize)) {
    if (pMVar1->pArray[(uint)Var] == 0) {
      p_00 = p->vHeap;
      pMVar1->pArray[(uint)Var] = p_00->nSize;
      Msat_IntVecPush(p_00,Var);
      Msat_HeapPercolateUp(p,p->vIndex->pArray[(uint)Var]);
    }
    iVar2 = clock_gettime(3,&local_30);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    timeSelect = timeSelect + lVar4 + lVar3;
    return;
  }
  __assert_fail("HOKAY(p, n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatOrderH.c"
                ,0x14b,"void Msat_HeapInsert(Msat_Order_t *, int)");
}

Assistant:

void Msat_OrderVarUnassigned( Msat_Order_t * p, int Var )
{
//    if (!heap.inHeap(x))
//        heap.insert(x);

    abctime clk = Abc_Clock();
    if ( !HINHEAP(p,Var) )
        Msat_HeapInsert( p, Var );
timeSelect += Abc_Clock() - clk;
}